

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::addStructType
          (UniformCollection *this,StructType *type)

{
  pointer *pppSVar1;
  iterator __position;
  StructType *local_8;
  
  __position._M_current =
       (this->m_structTypes).
       super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = type;
    std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
    _M_realloc_insert<glu::StructType_const*const&>
              ((vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)
               &this->m_structTypes,__position,&local_8);
  }
  else {
    *__position._M_current = type;
    pppSVar1 = &(this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void				addStructType		(const StructType* const type)	{ m_structTypes.push_back(type);	}